

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  IRIns *ir;
  IRIns *pIVar1;
  uint uVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  TValue TVar4;
  uint uVar5;
  ulong uVar6;
  lua_Number lVar7;
  
  uVar6 = (ulong)ref;
  pIVar1 = T->ir;
  while( true ) {
    ir = pIVar1 + uVar6;
    if ((uint)uVar6 < 0x8000) {
      lj_ir_kvalue(J->L,o,ir);
      return;
    }
    uVar2 = (uint)*(ushort *)((long)pIVar1 + uVar6 * 8 + 6);
    if ((rfilt >> (uVar6 & 0x3f) & 1) != 0) {
      uVar2 = snap_renameref(T,snapno,(uint)uVar6,uVar2);
    }
    if (0xff < uVar2) break;
    if (uVar2 < 0x80) {
      uVar5 = (ir->field_1).t.irt & 0x1f;
      if (uVar5 - 0xf < 5) {
        lVar7 = (lua_Number)(int)ex->gpr[uVar2];
LAB_0013992c:
        o->n = lVar7;
        return;
      }
      if ((byte)uVar5 == 3) {
        TVar4 = *(TValue *)(ex->gpr + uVar2);
        goto LAB_00139946;
      }
      if (uVar5 == 0xe) {
        lVar7 = ex->fpr[uVar2 - 0x10];
        goto LAB_0013992c;
      }
      if ((byte)uVar5 < 3) goto LAB_0013995c;
      aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
               (ex->gpr + uVar2);
      goto LAB_0013995a;
    }
    uVar6 = (ulong)(ir->field_0).op1;
  }
  uVar2 = uVar2 >> 8;
  uVar5 = (ir->field_1).t.irt & 0x1f;
  if (uVar5 - 0xf < 5) {
    lVar7 = (lua_Number)ex->spill[uVar2];
    goto LAB_0013992c;
  }
  if (((char)uVar5 == '\x03') || (uVar5 == 0xe)) {
    TVar4 = *(TValue *)(ex->spill + uVar2);
LAB_00139946:
    *o = TVar4;
    return;
  }
  aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
           (ex->spill + uVar2);
LAB_0013995a:
  (o->field_2).field_0 = aVar3;
LAB_0013995c:
  (o->field_2).it = ~uVar5;
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    lj_ir_kvalue(J->L, o, ir);
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
    } else {
      lua_assert(!irt_ispri(t));  /* PRI refs never have a spill slot. */
      setgcrefi(o->gcr, *sps);
      setitype(o, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lua_assert(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
    } else {
      if (!irt_ispri(t))
	setgcrefi(o->gcr, ex->gpr[r-RID_MIN_GPR]);
      setitype(o, irt_toitype(t));
    }
  }
}